

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-constant.h
# Opt level: O2

void __thiscall
wasm::PossibleConstantValues::note(PossibleConstantValues *this,Expression *expr,Module *wasm)

{
  bool bVar1;
  Global *pGVar2;
  Literal local_38;
  
  bVar1 = Properties::isConstantExpression(expr);
  if (bVar1) {
    Properties::getLiteral(&local_38,expr);
    note<wasm::Literal>(this,&local_38);
    Literal::~Literal(&local_38);
    return;
  }
  if (expr->_id == GlobalGetId) {
    pGVar2 = Module::getGlobal(wasm,(Name)expr[1]);
    if (pGVar2->mutable_ == false) {
      note<wasm::Name>(this,(Name)expr[1]);
      return;
    }
  }
  noteUnknown(this);
  return;
}

Assistant:

void note(Expression* expr, Module& wasm) {
    // If this is a constant literal value, note that.
    if (Properties::isConstantExpression(expr)) {
      note(Properties::getLiteral(expr));
      return;
    }

    // If this is an immutable global that we get, note that.
    if (auto* get = expr->dynCast<GlobalGet>()) {
      auto* global = wasm.getGlobal(get->name);
      if (global->mutable_ == Immutable) {
        note(get->name);
        return;
      }
    }

    // Otherwise, this is not something we can reason about.
    noteUnknown();
  }